

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptor::DebugString
          (MethodDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  Descriptor *pDVar2;
  MethodOptions *from;
  ServiceDescriptor *this_00;
  FileDescriptor *this_01;
  DescriptorPool *pool;
  char *pcVar3;
  string_view format;
  Arg *in_stack_fffffffffffffc10;
  string *output;
  Arg local_340;
  Arg local_310;
  string_view local_2e0;
  undefined1 local_2d0 [8];
  string formatted_options;
  MethodOptions full_options;
  Arg local_228;
  string_view local_1f8;
  Arg local_1e8;
  string_view local_1b8;
  Arg local_1a8;
  string_view local_178;
  Arg local_168;
  Arg local_138;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  MethodDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator(&local_49);
  anon_unknown_24::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::MethodDescriptor>
            ((SourceLocationCommentPrinter *)local_f8,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_108,"$0rpc $1($4.$2) returns ($5.$3)");
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  local_178 = name(this);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_168,local_178);
  pDVar2 = input_type(this);
  local_1b8 = Descriptor::full_name(pDVar2);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_1a8,local_1b8);
  pDVar2 = output_type(this);
  local_1f8 = Descriptor::full_name(pDVar2);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_1e8,local_1f8);
  bVar1 = client_streaming(this);
  pcVar3 = anon_var_dwarf_37cdd0 + 5;
  if (bVar1) {
    pcVar3 = "stream ";
  }
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_228,pcVar3);
  bVar1 = server_streaming(this);
  pcVar3 = anon_var_dwarf_37cdd0 + 5;
  if (bVar1) {
    pcVar3 = "stream ";
  }
  absl::lts_20250127::substitute_internal::Arg::Arg
            ((Arg *)((long)&full_options.field_0 + 0x40),pcVar3);
  format._M_str = (char *)&local_138;
  format._M_len = (size_t)local_108._M_str;
  absl::lts_20250127::SubstituteAndAppend
            ((lts_20250127 *)contents,(Nonnull<std::string_*>)local_108._M_len,format,&local_168,
             &local_1a8,&local_1e8,&local_228,(Arg *)((long)&full_options.field_0 + 0x40),
             in_stack_fffffffffffffc10);
  from = options(this);
  MethodOptions::MethodOptions((MethodOptions *)((long)&formatted_options.field_2 + 8),from);
  anon_unknown_24::CopyFeaturesToOptions<google::protobuf::MethodOptions>
            (this->proto_features_,(MethodOptions *)((long)&formatted_options.field_2 + 8));
  std::__cxx11::string::string((string *)local_2d0);
  this_00 = service(this);
  this_01 = ServiceDescriptor::file(this_00);
  pool = FileDescriptor::pool(this_01);
  bVar1 = anon_unknown_24::FormatLineOptions
                    (depth + 1,(Message *)((long)&formatted_options.field_2 + 8),pool,
                     (string *)local_2d0);
  if (bVar1) {
    output = contents;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2e0," {\n$0$1}\n");
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
              (&local_310,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
              (&local_340,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    absl::lts_20250127::SubstituteAndAppend(output,local_2e0,&local_310,&local_340);
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  std::__cxx11::string::~string((string *)local_2d0);
  MethodOptions::~MethodOptions((MethodOptions *)((long)&formatted_options.field_2 + 8));
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void MethodDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(
      contents, "$0rpc $1($4.$2) returns ($5.$3)", prefix, name(),
      input_type()->full_name(), output_type()->full_name(),
      client_streaming() ? "stream " : "", server_streaming() ? "stream " : "");

  MethodOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  std::string formatted_options;
  if (FormatLineOptions(depth, full_options, service()->file()->pool(),
                        &formatted_options)) {
    absl::SubstituteAndAppend(contents, " {\n$0$1}\n", formatted_options,
                              prefix);
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}